

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

ScriptError_t ParseScriptError(string *name)

{
  bool bVar1;
  long in_FS_OFFSET;
  ScriptErrorDesc *se;
  ScriptErrorDesc *__end1;
  ScriptErrorDesc *__begin1;
  ScriptErrorDesc (*__range1) [43];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  const_string *msg;
  undefined1 *line_num;
  const_string *in_stack_ffffffffffffff10;
  unit_test_log_t *in_stack_ffffffffffffff18;
  ScriptErrorDesc *local_d0;
  ScriptError_t local_b4;
  const_string local_b0 [5];
  lazy_ostream local_60 [2];
  assertion_result local_40;
  undefined1 local_28 [16];
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0 = script_errors;
  do {
    if (local_d0 == (ScriptErrorDesc *)&PTR_typeinfo_023cf700) {
      do {
        msg = (const_string *)&stack0xffffffffffffffe8;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffee8,
                   (pointer)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   (unsigned_long)in_stack_fffffffffffffed8);
        line_num = local_28;
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffed8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(size_t)line_num,msg);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   (char (*) [22])in_stack_fffffffffffffed8);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>
                    *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   in_stack_fffffffffffffed8);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   (char (*) [22])in_stack_fffffffffffffed8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffee8,
                   (pointer)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                   (unsigned_long)in_stack_fffffffffffffed8);
        in_stack_fffffffffffffed8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        boost::test_tools::tt_detail::report_assertion(&local_40,local_60,local_b0,0x6f,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[22],_const_char_(&)[22]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[22],_const_char_(&)[22]>
                    *)in_stack_fffffffffffffed8);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffed8);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>
                            *)in_stack_fffffffffffffed8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffed8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      local_b4 = SCRIPT_ERR_UNKNOWN_ERROR;
LAB_00a4afc6:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return local_b4;
    }
    bVar1 = std::operator==(in_stack_fffffffffffffee8,
                            (char *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    if (bVar1) {
      local_b4 = local_d0->err;
      goto LAB_00a4afc6;
    }
    local_d0 = local_d0 + 1;
  } while( true );
}

Assistant:

static ScriptError_t ParseScriptError(const std::string& name)
{
    for (const auto& se : script_errors)
        if (se.name == name)
            return se.err;
    BOOST_ERROR("Unknown scripterror \"" << name << "\" in test description");
    return SCRIPT_ERR_UNKNOWN_ERROR;
}